

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O0

void predict_or_learn<true,false,true,false>(oaa *o,single_learner *base,example *ec)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ostream *poVar6;
  float *pfVar7;
  long in_RDX;
  ulong *in_RDI;
  uint32_t i_3;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  v_array<float> scores_array;
  uint32_t prediction;
  stringstream outputStringStream;
  label_t mc_label_data;
  undefined4 in_stack_fffffffffffffde8;
  float in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  uint in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  uint in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  uint uVar8;
  undefined4 in_stack_fffffffffffffe0c;
  size_t in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  uint local_1ac;
  stringstream local_1a8 [392];
  ulong local_20;
  long local_18;
  ulong *local_8;
  
  local_20 = *(ulong *)(in_RDX + 0x6828);
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (((uint)local_20 == 0) || ((*in_RDI < (local_20 & 0xffffffff) && ((uint)local_20 != -1)))) {
    poVar6 = std::operator<<((ostream *)&std::cout,"label ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)local_20);
    poVar6 = std::operator<<(poVar6," is not in {1,");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*local_8);
    poVar6 = std::operator<<(poVar6,"} This won\'t work right.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1ac = 1;
  uVar2 = *(undefined8 *)(local_18 + 0x6850);
  uVar3 = *(undefined8 *)(local_18 + 0x6858);
  uVar4 = *(undefined8 *)(local_18 + 0x6860);
  uVar5 = *(undefined8 *)(local_18 + 0x6868);
  *(undefined4 *)(local_18 + 0x6830) = 0;
  *(undefined8 *)(local_18 + 0x6828) = 0x7f7fffff;
  LEARNER::learner<char,_example>::multipredict
            ((learner<char,_example> *)0x0,(example *)CONCAT44(0x7f7fffff,in_stack_fffffffffffffe18)
             ,in_stack_fffffffffffffe10,
             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
             (polyprediction *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             SUB41((uint)in_stack_fffffffffffffdfc >> 0x18,0));
  for (uVar8 = 2; (ulong)uVar8 <= *local_8; uVar8 = uVar8 + 1) {
    fVar1 = *(float *)(local_8[2] + (ulong)(uVar8 - 1) * 0x20);
    pfVar7 = (float *)(local_8[2] + (ulong)(local_1ac - 1) * 0x20);
    if (*pfVar7 <= fVar1 && fVar1 != *pfVar7) {
      local_1ac = uVar8;
    }
  }
  if (*(long *)(local_18 + 0x68c0) != 0) {
    for (in_stack_fffffffffffffe04 = 1; (ulong)in_stack_fffffffffffffe04 <= *local_8;
        in_stack_fffffffffffffe04 = in_stack_fffffffffffffe04 + 1) {
      add_passthrough_feature_magic
                ((example *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                 CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 in_stack_fffffffffffffdec);
    }
  }
  for (uVar8 = 1; (ulong)uVar8 <= *local_8; uVar8 = uVar8 + 1) {
    in_stack_fffffffffffffdf4 = *(uint *)(&DAT_003e9b24 + (ulong)((uint)local_20 == uVar8) * 4);
    *(undefined4 *)(local_18 + 0x6830) = 0;
    *(ulong *)(local_18 + 0x6828) = (ulong)in_stack_fffffffffffffdf4;
    *(undefined4 *)(local_18 + 0x6850) = *(undefined4 *)(local_8[2] + (ulong)(uVar8 - 1) * 0x20);
    LEARNER::learner<char,_example>::update
              ((learner<char,_example> *)CONCAT44(in_stack_fffffffffffffe04,uVar8),(example *)0x0,
               CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  }
  v_array<float>::clear
            ((v_array<float> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  for (uVar8 = 0; (ulong)uVar8 < *local_8; uVar8 = uVar8 + 1) {
    v_array<float>::push_back
              ((v_array<float> *)CONCAT44(in_stack_fffffffffffffdf4,uVar8),
               (float *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  }
  *(undefined8 *)(local_18 + 0x6850) = uVar2;
  *(undefined8 *)(local_18 + 0x6858) = uVar3;
  *(undefined8 *)(local_18 + 0x6860) = uVar4;
  *(undefined8 *)(local_18 + 0x6868) = uVar5;
  *(ulong *)(local_18 + 0x6828) = local_20;
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}